

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

int __thiscall QDir::rmdir(QDir *this,char *__path)

{
  QDirPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QFileSystemEntry local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(__path + 0x10) == 0) {
    local_48.m_filePath.d.d._0_4_ = 2;
    local_48.m_filePath.d.size._4_4_ = 0;
    local_48.m_filePath.d._4_8_ = 0;
    local_48.m_filePath.d._12_8_ = 0;
    local_48.m_nativeFilePath.d.d = (Data *)0x455595;
    iVar3 = 0;
    QMessageLogger::warning((QMessageLogger *)&local_48,"QDir::rmdir: Empty or null file name");
  }
  else {
    pQVar1 = (this->d_ptr).d.ptr;
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    filePath((QString *)&local_68,this,(QString *)__path);
    _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
         (pQVar1->fileEngine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
    if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
        (QAbstractFileEngine *)0x0) {
      QFileSystemEntry::QFileSystemEntry(&local_48,(QString *)&local_68);
      iVar3 = QFileSystemEngine::rmdir((char *)&local_48);
      QFileSystemEntry::~QFileSystemEntry(&local_48);
    }
    else {
      iVar3 = (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                    _M_head_impl + 0x80))
                        (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                         &local_68,0);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::rmdir(const QString &dirName) const
{
    Q_D(const QDir);

    if (dirName.isEmpty()) {
        qWarning("QDir::rmdir: Empty or null file name");
        return false;
    }

    QString fn = filePath(dirName);
    if (!d->fileEngine)
        return QFileSystemEngine::rmdir(QFileSystemEntry(fn));

    return d->fileEngine->rmdir(fn, false);
}